

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O2

int alex::pow_2_round_up(int x)

{
  uint uVar1;
  
  uVar1 = (int)(x - 1U) >> 1 | x - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  return ((int)uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

inline int pow_2_round_up(int x) {
  --x;
  x |= x >> 1;
  x |= x >> 2;
  x |= x >> 4;
  x |= x >> 8;
  x |= x >> 16;
  return x + 1;
}